

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

string * testing::internal::
         DefaultParamName<libaom_test::FuncParam<void(*)(unsigned_char*,unsigned_int,unsigned_short_const*,unsigned_int,unsigned_short_const*,unsigned_int,unsigned_char_const*,unsigned_int,int,int,int,int,ConvolveParams*)>>
                   (TestParamInfo<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*)>_>
                    *info)

{
  Message *in_RSI;
  string *in_RDI;
  Message name_stream;
  unsigned_long *in_stack_ffffffffffffffb8;
  string *this;
  
  this = in_RDI;
  Message::Message(in_RSI);
  Message::operator<<((Message *)in_RDI,in_stack_ffffffffffffffb8);
  Message::GetString_abi_cxx11_((Message *)this);
  Message::~Message((Message *)0xa9f22a);
  return this;
}

Assistant:

std::string DefaultParamName(const TestParamInfo<ParamType>& info) {
  Message name_stream;
  name_stream << info.index;
  return name_stream.GetString();
}